

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QByteArray * removeTrailingSlashes(QByteArray *path)

{
  ulong uVar1;
  
  uVar1 = (path->d).size;
  while ((1 < uVar1 && ((path->d).ptr[uVar1 - 1] == '/'))) {
    QByteArray::chop(path,1);
    uVar1 = (path->d).size;
  }
  return path;
}

Assistant:

static QByteArray &removeTrailingSlashes(QByteArray &path)
{
    // Darwin doesn't support trailing /'s, so remove for everyone
    while (path.size() > 1 && path.endsWith('/'))
        path.chop(1);

    return path;
}